

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O1

int ctemplate_htmlparser::htmlparser_attr_type(htmlparser_ctx *ctx)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  meta_redirect_type_enum mVar5;
  char *pcVar6;
  char *pcVar7;
  
  iVar3 = statemachine_get_state(ctx->statemachine);
  if ((long)iVar3 - 0x15U < 0xfffffffffffffff8) {
    return 0;
  }
  pcVar6 = ctx->attr;
  bVar1 = ctx->attr[0];
  switch(bVar1 - 0x61) {
  case 0:
switchD_00130803_caseD_0:
    iVar3 = strcmp(pcVar6,"action");
    if (iVar3 == 0) {
      return 2;
    }
    pcVar7 = "archive";
    goto LAB_001308cc;
  case 1:
switchD_00130803_caseD_1:
    pcVar7 = "background";
    break;
  case 2:
switchD_00130803_caseD_2:
    iVar3 = strcmp(pcVar6,"cite");
    if (iVar3 == 0) {
      return 2;
    }
    iVar3 = strcmp(pcVar6,"classid");
    if (iVar3 == 0) {
      return 2;
    }
    pcVar7 = "codebase";
    goto LAB_001308cc;
  case 3:
switchD_00130803_caseD_3:
    iVar3 = strcmp(pcVar6,"data");
    if (iVar3 == 0) {
      return 2;
    }
    pcVar7 = "dynsrc";
LAB_001308cc:
    iVar3 = strcmp(pcVar6,pcVar7);
    if (iVar3 == 0) {
      return 2;
    }
  default:
    goto switchD_00130803_caseD_4;
  case 7:
switchD_00130803_caseD_7:
    pcVar7 = "href";
    break;
  case 0xb:
switchD_00130803_caseD_b:
    pcVar7 = "longdesc";
    break;
  case 0xe:
    if (ctx->attr[1] == 'n') {
      return 3;
    }
    switch(bVar1 - 0x61) {
    case 0:
      goto switchD_00130803_caseD_0;
    case 1:
      goto switchD_00130803_caseD_1;
    case 2:
      goto switchD_00130803_caseD_2;
    case 3:
      goto switchD_00130803_caseD_3;
    case 4:
    case 5:
    case 6:
    case 8:
    case 9:
    case 10:
      break;
    case 7:
      goto switchD_00130803_caseD_7;
    case 0xb:
      goto switchD_00130803_caseD_b;
    default:
      if (bVar1 == 0x73) goto switchD_00130803_caseD_12;
      if (bVar1 == 0x75) goto switchD_00130803_caseD_14;
    }
    goto switchD_00130803_caseD_4;
  case 0x12:
switchD_00130803_caseD_12:
    pcVar7 = "src";
    break;
  case 0x14:
switchD_00130803_caseD_14:
    pcVar7 = "usemap";
  }
  iVar3 = strcmp(pcVar6,pcVar7);
  if (iVar3 == 0) {
    iVar3 = 2;
  }
  else {
switchD_00130803_caseD_4:
    iVar3 = strcmp(pcVar6,"style");
    if (iVar3 == 0) {
      iVar3 = 4;
    }
    else {
      cVar2 = ctx->tag[0];
      iVar3 = statemachine_get_state(ctx->statemachine);
      pcVar7 = (char *)0x0;
      if ((long)iVar3 - 0xdU < 8) {
        pcVar7 = pcVar6;
      }
      if ((((cVar2 != '\0') && (iVar4 = strcmp(ctx->tag,"meta"), (long)iVar3 - 0xdU < 8)) &&
          (iVar4 == 0)) && (iVar3 = strcmp(pcVar7,"content"), iVar3 == 0)) {
        pcVar6 = htmlparser_value(ctx);
        mVar5 = meta_redirect_type(pcVar6);
        if (mVar5 != META_REDIRECT_TYPE_NONE) {
          return 2;
        }
      }
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int htmlparser_attr_type(htmlparser_ctx *ctx)
{
    if (!htmlparser_in_attr(ctx))
        return HTMLPARSER_ATTR_NONE;

    if (is_js_attribute(ctx->attr))
        return HTMLPARSER_ATTR_JS;

    if (is_uri_attribute(ctx->attr))
        return HTMLPARSER_ATTR_URI;

    if (is_style_attribute(ctx->attr))
        return HTMLPARSER_ATTR_STYLE;

    const char* tag = htmlparser_tag(ctx);
    const char* attr = htmlparser_attr(ctx);

    /* Special logic to handle meta redirect type tags. */
    if (tag && strcmp(tag, "meta") == 0 &&
        attr && strcmp(attr, "content") == 0) {

      const char* value = htmlparser_value(ctx);
      meta_redirect_type_enum redirect_type = meta_redirect_type(value);

      if (redirect_type == META_REDIRECT_TYPE_URL ||
          redirect_type == META_REDIRECT_TYPE_URL_START)
        return HTMLPARSER_ATTR_URI;
    }

    return HTMLPARSER_ATTR_REGULAR;
}